

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O1

void __thiscall Centaurus::ATNNode<wchar_t>::ATNNode(ATNNode<wchar_t> *this,ATNNodeType type)

{
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_0019d150;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_type = type;
  (this->m_invoke)._vptr_Identifier = (_func_int **)&PTR__Identifier_0019cdf0;
  (this->m_invoke).m_id._M_dataplus._M_p = (pointer)&(this->m_invoke).m_id.field_2;
  (this->m_invoke).m_id._M_string_length = 0;
  (this->m_invoke).m_id.field_2._M_local_buf[0] = L'\0';
  NFA<wchar_t>::NFA(&this->m_nfa);
  (this->m_literal)._M_dataplus._M_p = (pointer)&(this->m_literal).field_2;
  (this->m_literal)._M_string_length = 0;
  (this->m_literal).field_2._M_local_buf[0] = L'\0';
  this->m_localid = -1;
  return;
}

Assistant:

ATNNode(ATNNodeType type)
        : m_type(type), m_localid(-1)
    {
    }